

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ListColumnData::FetchRow
          (ListColumnData *this,TransactionData transaction,ColumnFetchState *state,row_t row_id,
          Vector *result,idx_t result_idx)

{
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *this_00;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  Vector *result_00;
  uint64_t uVar3;
  ListColumnData *pLVar4;
  reference this_01;
  type pCVar5;
  ColumnSegment *pCVar6;
  idx_t iVar7;
  tuple<duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_> __s;
  LogicalType *other;
  pointer this_02;
  pointer pCVar8;
  type pCVar9;
  templated_unique_single_t child_state;
  __uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>_> local_d8;
  Vector *local_d0;
  uint64_t local_c8;
  ListColumnData *local_c0;
  uint64_t local_b8;
  LogicalType local_b0;
  Vector local_98;
  
  local_d0 = result;
  if ((state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (state->child_states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_98._0_8_ = operator_new(0x50);
    *(long *)(local_98._0_8_ + 0x20) = 0;
    *(long *)(local_98._0_8_ + 0x28) = 0;
    *(long **)local_98._0_8_ = (long *)(local_98._0_8_ + 0x30);
    *(long *)(local_98._0_8_ + 8) = 1;
    *(long *)(local_98._0_8_ + 0x10) = 0;
    *(long *)(local_98._0_8_ + 0x18) = 0;
    *(undefined4 *)(local_98._0_8_ + 0x20) = 0x3f800000;
    *(long *)(local_98._0_8_ + 0x38) = 0;
    *(long *)(local_98._0_8_ + 0x40) = 0;
    *(long *)(local_98._0_8_ + 0x28) = 0;
    *(long *)(local_98._0_8_ + 0x30) = 0;
    *(long *)(local_98._0_8_ + 0x48) = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,std::default_delete<duckdb::ColumnFetchState>,true>>>
                *)&state->child_states,
               (unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
                *)&local_98);
    ::std::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>::
    ~unique_ptr((unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>_>
                 *)&local_98);
  }
  if ((this->super_ColumnData).start == row_id) {
    local_c8 = 0;
  }
  else {
    local_c8 = FetchListOffset(this,row_id - 1);
  }
  local_b8 = FetchListOffset(this,row_id);
  this_01 = vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_true>
            ::operator[](&state->child_states,0);
  pCVar5 = unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>
           ::operator*(this_01);
  local_c0 = this;
  pCVar6 = SegmentTree<duckdb::ColumnSegment,_false>::GetSegment
                     (&(this->validity).super_ColumnData.data.
                       super_SegmentTree<duckdb::ColumnSegment,_false>,row_id);
  result_00 = local_d0;
  (*((pCVar6->function)._M_data)->fetch_row)
            (pCVar6,pCVar5,row_id - (pCVar6->super_SegmentBase<duckdb::ColumnSegment>).start,
             local_d0,result_idx);
  ColumnData::FetchUpdateRow
            (&(this->validity).super_ColumnData,transaction,row_id,result_00,result_idx);
  FlatVector::VerifyFlatVector(result_00);
  pdVar1 = result_00->data;
  iVar7 = ListVector::GetListSize(result_00);
  uVar3 = local_c8;
  *(idx_t *)(pdVar1 + result_idx * 0x10) = iVar7;
  iVar7 = local_b8 - local_c8;
  *(idx_t *)(pdVar1 + result_idx * 0x10 + 8) = iVar7;
  puVar2 = (result_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (local_b8 == local_c8) {
      return;
    }
  }
  else {
    if (local_b8 == local_c8) {
      return;
    }
    if ((1L << ((byte)result_idx & 0x3f) & puVar2[result_idx >> 6]) == 0) {
      return;
    }
  }
  __s.
  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>.
  super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>)
       operator_new(0x98);
  switchD_012e3010::default
            ((void *)__s.
                     super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>
                     .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl,0,0x98);
  local_d8._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>.
  super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>)
       (tuple<duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>)
       __s.
       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>
       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
  other = ListType::GetChildType(&local_d0->type);
  LogicalType::LogicalType(&local_b0,other);
  pLVar4 = local_c0;
  Vector::Vector(&local_98,&local_b0,iVar7);
  LogicalType::~LogicalType(&local_b0);
  this_02 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
            ::operator->((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                          *)&local_d8);
  ColumnScanState::Initialize(this_02,other,(optional_ptr<duckdb::TableScanOptions,_true>)0x0);
  this_00 = &pLVar4->child_column;
  pCVar8 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (this_00);
  pCVar9 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>::
           operator*((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                      *)&local_d8);
  (*pCVar8->_vptr_ColumnData[8])(pCVar8,pCVar9,uVar3 + (pLVar4->super_ColumnData).start);
  pCVar8 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (this_00);
  pCVar9 = unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>::
           operator*((unique_ptr<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState>,_true>
                      *)&local_d8);
  (*pCVar8->_vptr_ColumnData[0xc])(pCVar8,pCVar9,&local_98,iVar7,0);
  ListVector::Append(local_d0,&local_98,iVar7,0);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)((long)&local_98 + 8));
  if ((_Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>)
      local_d8._M_t.
      super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>
      .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl !=
      (ColumnScanState *)0x0) {
    ::std::default_delete<duckdb::ColumnScanState>::operator()
              ((default_delete<duckdb::ColumnScanState> *)&local_d8,
               (ColumnScanState *)
               local_d8._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState>_>
               .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void ListColumnData::FetchRow(TransactionData transaction, ColumnFetchState &state, row_t row_id, Vector &result,
                              idx_t result_idx) {
	// insert any child states that are required
	// we need two (validity & list child)
	// note that we need a scan state for the child vector
	// this is because we will (potentially) fetch more than one tuple from the list child
	if (state.child_states.empty()) {
		auto child_state = make_uniq<ColumnFetchState>();
		state.child_states.push_back(std::move(child_state));
	}

	// now perform the fetch within the segment
	auto start_offset = idx_t(row_id) == this->start ? 0 : FetchListOffset(UnsafeNumericCast<idx_t>(row_id - 1));
	auto end_offset = FetchListOffset(UnsafeNumericCast<idx_t>(row_id));
	validity.FetchRow(transaction, *state.child_states[0], row_id, result, result_idx);

	auto &validity = FlatVector::Validity(result);
	auto list_data = FlatVector::GetData<list_entry_t>(result);
	auto &list_entry = list_data[result_idx];
	// set the list entry offset to the size of the current list
	list_entry.offset = ListVector::GetListSize(result);
	list_entry.length = end_offset - start_offset;
	if (!validity.RowIsValid(result_idx)) {
		// the list is NULL! no need to fetch the child
		D_ASSERT(list_entry.length == 0);
		return;
	}

	// now we need to read from the child all the elements between [offset...length]
	auto child_scan_count = list_entry.length;
	if (child_scan_count > 0) {
		auto child_state = make_uniq<ColumnScanState>();
		auto &child_type = ListType::GetChildType(result.GetType());
		Vector child_scan(child_type, child_scan_count);
		// seek the scan towards the specified position and read [length] entries
		child_state->Initialize(child_type, nullptr);
		child_column->InitializeScanWithOffset(*child_state, start + start_offset);
		D_ASSERT(child_type.InternalType() == PhysicalType::STRUCT ||
		         child_state->row_index + child_scan_count - this->start <= child_column->GetMaxEntry());
		child_column->ScanCount(*child_state, child_scan, child_scan_count);

		ListVector::Append(result, child_scan, child_scan_count);
	}
}